

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall Pathie::Path::make_symlink(Path *this,Path *target)

{
  int iVar1;
  ErrnoError *this_00;
  int *piVar2;
  string nstr;
  string target_nstr;
  string local_50;
  string local_30;
  
  utf8_to_filename(&local_30,&target->m_path);
  utf8_to_filename(&local_50,&this->m_path);
  iVar1 = symlink(local_30._M_dataplus._M_p,local_50._M_dataplus._M_p);
  if (-1 < iVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void Path::make_symlink(const Path& target) const
{
#if defined(_PATHIE_UNIX)
  std::string target_nstr = target.native();
  std::string nstr = native();

  if (symlink(target_nstr.c_str(), nstr.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring source = utf8_to_utf16(m_path);
  std::wstring target2 = utf8_to_utf16(target.m_path);

  DWORD flags = 0;
  if (target.is_directory())
    flags = SYMBOLIC_LINK_FLAG_DIRECTORY;

  if (CreateSymbolicLinkW(source.c_str(), target2.c_str(), flags) == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }
#else
#error Unsupported system.
#endif
}